

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall Array<const_char_*>::reserve(Array<const_char_*> *this,usize size)

{
  char **ppcVar1;
  char **ppcVar2;
  char **ppcVar3;
  char **ppcVar4;
  ulong uVar5;
  char **ppcVar6;
  
  if (size <= this->_capacity) {
    if (size == 0) {
      return;
    }
    if ((this->_begin).item != (char **)0x0) {
      return;
    }
    if (size <= this->_capacity) goto LAB_00105c87;
  }
  this->_capacity = size;
LAB_00105c87:
  uVar5 = this->_capacity | 3;
  this->_capacity = uVar5;
  ppcVar3 = (char **)operator_new__(uVar5 << 3);
  ppcVar1 = (this->_begin).item;
  ppcVar6 = ppcVar3;
  if (ppcVar1 != (char **)0x0) {
    ppcVar2 = (this->_end).item;
    for (ppcVar4 = ppcVar1; ppcVar4 != ppcVar2; ppcVar4 = ppcVar4 + 1) {
      *ppcVar6 = *ppcVar4;
      ppcVar6 = ppcVar6 + 1;
    }
    operator_delete__(ppcVar1);
  }
  (this->_begin).item = ppcVar3;
  (this->_end).item = ppcVar6;
  return;
}

Assistant:

void reserve(usize size)
  {
    if(size > _capacity || (!_begin.item && size > 0))
    {
      if (size > _capacity)
        _capacity = size;
      _capacity |= 0x03;
      T* newData = (T*)new char[sizeof(T) * _capacity];
      T* dest = newData;
      if(_begin.item)
      {
        for (T* src = _begin.item, * end = _end.item; src != end; ++src, ++dest)
        {
#ifdef VERIFY
          VERIFY(new(dest)T(*src) == dest);
#else
          new(dest)T(*src);
#endif
          src->~T();
        }
        delete[] (char*)_begin.item;
      }
      _begin.item = newData;
      _end.item = dest;
    }
  }